

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTcPrsOpBinGroupCompare::parse(CTcPrsOpBinGroupCompare *this)

{
  int iVar1;
  tc_toktyp_t tVar2;
  undefined4 extraout_var;
  CTPNArglist *pCVar3;
  CTcPrsNode *pCVar4;
  char *pcVar5;
  CTcToken *pCVar6;
  CTcPrsNode *lhs;
  _func_int **local_38;
  
  iVar1 = (**((this->super_CTcPrsOpBinGroup).left_)->_vptr_CTcPrsOp)();
  if ((CTcPrsNode *)CONCAT44(extraout_var,iVar1) == (CTcPrsNode *)0x0) {
    return (CTcPrsNode *)0x0;
  }
  local_38 = (_func_int **)&PTR_gen_code_00352590;
  lhs = (CTcPrsNode *)CONCAT44(extraout_var,iVar1);
LAB_0022b097:
  while( true ) {
    do {
      iVar1 = CTcPrsOpBinGroup::find_and_apply_op(&this->super_CTcPrsOpBinGroup,&lhs);
    } while (iVar1 != 0);
    if (((G_tok->curtok_).typ_ != TOKT_SYM) ||
       (iVar1 = CTcToken::text_matches(&G_tok->curtok_,"is",2), iVar1 == 0)) break;
    tVar2 = CTcTokenizer::next(G_tok);
    if (tVar2 != TOKT_SYM) {
LAB_0022b13a:
      CTcTokenizer::unget(G_tok);
      break;
    }
    pCVar6 = &G_tok->curtok_;
    pcVar5 = "in";
    iVar1 = CTcToken::text_matches(pCVar6,"in",2);
    if (iVar1 == 0) goto LAB_0022b13a;
    pCVar3 = parse_inlist((CTcPrsOpBinGroupCompare *)pCVar6);
    if (pCVar3 == (CTPNArglist *)0x0) {
      return (CTcPrsNode *)0x0;
    }
    pCVar4 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x20,(size_t)pcVar5);
    pCVar4[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)lhs;
    pCVar4[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar3;
    *(byte *)&pCVar4[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
         *(byte *)&pCVar4[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase & 0xfe;
    (pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = local_38;
    lhs = pCVar4;
  }
  if ((G_tok->curtok_).typ_ != TOKT_SYM) {
    return lhs;
  }
  iVar1 = CTcToken::text_matches(&G_tok->curtok_,"not",3);
  if (iVar1 == 0) {
    return lhs;
  }
  tVar2 = CTcTokenizer::next(G_tok);
  if (tVar2 == TOKT_SYM) {
    pCVar6 = &G_tok->curtok_;
    pcVar5 = "in";
    iVar1 = CTcToken::text_matches(pCVar6,"in",2);
    if (iVar1 != 0) {
      pCVar3 = parse_inlist((CTcPrsOpBinGroupCompare *)pCVar6);
      if (pCVar3 == (CTPNArglist *)0x0) {
        return (CTcPrsNode *)0x0;
      }
      pCVar4 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x20,(size_t)pcVar5);
      pCVar4[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)lhs;
      pCVar4[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar3;
      *(byte *)&pCVar4[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           *(byte *)&pCVar4[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase & 0xfe;
      (pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00352698;
      lhs = pCVar4;
      goto LAB_0022b097;
    }
  }
  CTcTokenizer::unget(G_tok);
  return lhs;
}

Assistant:

CTcPrsNode *CTcPrsOpBinGroupCompare::parse() const
{
    /* parse our left side - if that fails, return failure */
    CTcPrsNode *lhs = left_->parse();
    if (lhs == 0)
        return 0;

    /* keep going as long as we find one of our operators */
    for (;;)
    {
        /* 
         *   try one of our regular operators - if we find it, go back for
         *   another round to see if there's another operator following
         *   the next expression
         */
        if (find_and_apply_op(&lhs))
            continue;

        /* 
         *   check for the 'is in' operator - 'is' and 'in' aren't
         *   keywords, so we must check for symbol tokens with the text of
         *   these context-sensitive keywords 
         */
        if (G_tok->cur() == TOKT_SYM
            && G_tok->getcur()->text_matches("is", 2))
        {
            /* we have 'is' - get the next token and check if it's 'in' */
            if (G_tok->next() == TOKT_SYM
                && G_tok->getcur()->text_matches("in", 2))
            {
                /* scan the expression list */
                CTPNArglist *rhs = parse_inlist();
                if (rhs == 0)
                    return 0;

                /* build the node */
                lhs = new CTPNIsIn(lhs, rhs);

                /* 
                 *   we've applied the 'is in' operator - go back for
                 *   another operator from the comparison group 
                 */
                continue;
            }
            else
            {
                /* it's not 'is in' - throw back the token and keep looking */
                G_tok->unget();
            }
        }

        /*
         *   Check for the 'not in' operator 
         */
        if (G_tok->cur() == TOKT_SYM
            && G_tok->getcur()->text_matches("not", 3))
        {
            /* we have 'is' - get the next token and check if it's 'in' */
            if (G_tok->next() == TOKT_SYM
                && G_tok->getcur()->text_matches("in", 2))
            {
                /* scan the expression list */
                CTPNArglist *rhs = parse_inlist();
                if (rhs == 0)
                    return 0;

                /* build the node */
                lhs = new CTPNNotIn(lhs, rhs);

                /* 
                 *   we've applied the 'is in' operator - go back for
                 *   another operator from the comparison group 
                 */
                continue;
            }
            else
            {
                /* it's not 'is in' - throw back the token and keep looking */
                G_tok->unget();
            }
        }

        /* we didn't find any of our operators - we're done */
        break;
    }

    /* return the expression */
    return lhs;
}